

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkt-proc-builder.cpp
# Opt level: O3

unique_ptr<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>_>
__thiscall
yactfr::internal::PktProcBuilder::_buildDsPktProc(PktProcBuilder *this,DataStreamType *dst)

{
  DsPktProc *this_00;
  _Base_ptr p_Var1;
  DataStreamType *in_RDX;
  pointer *__ptr;
  pointer *__ptr_2;
  _Rb_tree_header *p_Var2;
  _Head_base<0UL,_yactfr::internal::ErProc_*,_false> local_48;
  PktProcBuilder local_40;
  
  this_00 = (DsPktProc *)operator_new(0xc0);
  DsPktProc::DsPktProc(this_00,in_RDX);
  this->_traceType = (TraceType *)this_00;
  local_40._pktProc._M_t.
  super___uniq_ptr_impl<yactfr::internal::PktProc,_std::default_delete<yactfr::internal::PktProc>_>.
  _M_t.
  super__Tuple_impl<0UL,_yactfr::internal::PktProc_*,_std::default_delete<yactfr::internal::PktProc>_>
  .super__Head_base<0UL,_yactfr::internal::PktProc_*,_false>._M_head_impl =
       (__uniq_ptr_data<yactfr::internal::PktProc,_std::default_delete<yactfr::internal::PktProc>,_true,_true>
        )(__uniq_ptr_data<yactfr::internal::PktProc,_std::default_delete<yactfr::internal::PktProc>,_true,_true>
          )this;
  _buildReadScopeInstr
            ((PktProcBuilder *)dst,PacketContext,
             (DataType *)
             (in_RDX->_pktCtxType)._M_t.
             super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
             .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl,
             &this_00->_pktPreambleProc);
  _buildReadScopeInstr
            ((PktProcBuilder *)dst,EventRecordHeader,
             (DataType *)
             (in_RDX->_erHeaderType)._M_t.
             super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
             .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl,
             &this_00->_erPreambleProc);
  _buildReadScopeInstr
            ((PktProcBuilder *)dst,EventRecordCommonContext,
             (DataType *)
             (in_RDX->_erCommonCtxType)._M_t.
             super___uniq_ptr_impl<const_yactfr::StructureType,_std::default_delete<const_yactfr::StructureType>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_yactfr::StructureType_*,_std::default_delete<const_yactfr::StructureType>_>
             .super__Head_base<0UL,_const_yactfr::StructureType_*,_false>._M_head_impl,
             &this_00->_erPreambleProc);
  p_Var1 = (in_RDX->_erts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(in_RDX->_erts)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      _buildErProc(&local_40,(EventRecordType *)dst);
      if ((ErProc *)local_40._traceType == (ErProc *)0x0) {
        __assert_fail("erProc",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/pkt-proc-builder.cpp"
                      ,0x360,
                      "std::unique_ptr<DsPktProc> yactfr::internal::PktProcBuilder::_buildDsPktProc(const DataStreamType &)"
                     );
      }
      local_48._M_head_impl = (ErProc *)local_40._traceType;
      local_40._traceType = (TraceType *)0x0;
      DsPktProc::addErProc
                (this_00,(unique_ptr<yactfr::internal::ErProc,_std::default_delete<yactfr::internal::ErProc>_>
                          *)&local_48);
      if (local_48._M_head_impl != (ErProc *)0x0) {
        std::default_delete<yactfr::internal::ErProc>::operator()
                  ((default_delete<yactfr::internal::ErProc> *)&local_48,local_48._M_head_impl);
      }
      local_48._M_head_impl = (ErProc *)0x0;
      if ((ErProc *)local_40._traceType != (ErProc *)0x0) {
        std::default_delete<yactfr::internal::ErProc>::operator()
                  ((default_delete<yactfr::internal::ErProc> *)&local_40,
                   (ErProc *)local_40._traceType);
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return (__uniq_ptr_data<yactfr::internal::DsPktProc,_std::default_delete<yactfr::internal::DsPktProc>,_true,_true>
          )(tuple<yactfr::internal::DsPktProc_*,_std::default_delete<yactfr::internal::DsPktProc>_>)
           local_40._pktProc._M_t.
           super___uniq_ptr_impl<yactfr::internal::PktProc,_std::default_delete<yactfr::internal::PktProc>_>
           ._M_t.
           super__Tuple_impl<0UL,_yactfr::internal::PktProc_*,_std::default_delete<yactfr::internal::PktProc>_>
           .super__Head_base<0UL,_yactfr::internal::PktProc_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<DsPktProc> PktProcBuilder::_buildDsPktProc(const DataStreamType& dst)
{
    auto dsPktProc = std::make_unique<DsPktProc>(dst);

    this->_buildReadScopeInstr(Scope::PacketContext, dst.packetContextType(),
                               dsPktProc->pktPreambleProc());
    this->_buildReadScopeInstr(Scope::EventRecordHeader, dst.eventRecordHeaderType(),
                               dsPktProc->erPreambleProc());
    this->_buildReadScopeInstr(Scope::EventRecordCommonContext,
                               dst.eventRecordCommonContextType(), dsPktProc->erPreambleProc());

    for (auto& ert : dst.eventRecordTypes()) {
        auto erProc = this->_buildErProc(*ert);

        assert(erProc);
        dsPktProc->addErProc(std::move(erProc));
    }

    return dsPktProc;
}